

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.hpp
# Opt level: O1

void __thiscall
hta::storage::file::Exception::Exception
          (Exception *this,string *message,path *filename,int error_number)

{
  pointer pcVar1;
  undefined8 *puVar2;
  long *plVar3;
  long *plVar4;
  ulong uVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  long *local_d0;
  undefined8 local_c8;
  long local_c0;
  undefined8 uStack_b8;
  ulong *local_b0;
  long local_a8;
  ulong local_a0 [2];
  ulong *local_90;
  long local_88;
  ulong local_80 [2];
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  long *local_50;
  long local_48;
  long local_40;
  long lStack_38;
  
  pcVar1 = (message->_M_dataplus)._M_p;
  local_b0 = local_a0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b0,pcVar1,pcVar1 + message->_M_string_length);
  std::__cxx11::string::append((char *)&local_b0);
  pcVar1 = (filename->_M_pathname)._M_dataplus._M_p;
  local_90 = local_80;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_90,pcVar1,pcVar1 + (filename->_M_pathname)._M_string_length);
  uVar5 = 0xf;
  if (local_b0 != local_a0) {
    uVar5 = local_a0[0];
  }
  if (uVar5 < (ulong)(local_88 + local_a8)) {
    uVar5 = 0xf;
    if (local_90 != local_80) {
      uVar5 = local_80[0];
    }
    if ((ulong)(local_88 + local_a8) <= uVar5) {
      puVar2 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_90,0,(char *)0x0,(ulong)local_b0);
      goto LAB_0017c46c;
    }
  }
  puVar2 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_b0,(ulong)local_90);
LAB_0017c46c:
  local_d0 = &local_c0;
  plVar3 = puVar2 + 2;
  if ((long *)*puVar2 == plVar3) {
    local_c0 = *plVar3;
    uStack_b8 = puVar2[3];
  }
  else {
    local_c0 = *plVar3;
    local_d0 = (long *)*puVar2;
  }
  local_c8 = puVar2[1];
  *puVar2 = plVar3;
  puVar2[1] = 0;
  *(undefined1 *)plVar3 = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_d0);
  plVar4 = plVar3 + 2;
  if ((long *)*plVar3 == plVar4) {
    local_60 = *plVar4;
    lStack_58 = plVar3[3];
    local_70 = &local_60;
  }
  else {
    local_60 = *plVar4;
    local_70 = (long *)*plVar3;
  }
  local_68 = plVar3[1];
  *plVar3 = (long)plVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  strerror(error_number);
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_70);
  plVar4 = plVar3 + 2;
  if ((long *)*plVar3 == plVar4) {
    local_40 = *plVar4;
    lStack_38 = plVar3[3];
    local_50 = &local_40;
  }
  else {
    local_40 = *plVar4;
    local_50 = (long *)*plVar3;
  }
  local_48 = plVar3[1];
  *plVar3 = (long)plVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  std::runtime_error::runtime_error((runtime_error *)this,(string *)&local_50);
  *(undefined ***)&this->super_Exception = &PTR__runtime_error_001b8a18;
  if (local_50 != &local_40) {
    operator_delete(local_50,local_40 + 1);
  }
  if (local_70 != &local_60) {
    operator_delete(local_70,local_60 + 1);
  }
  if (local_d0 != &local_c0) {
    operator_delete(local_d0,local_c0 + 1);
  }
  if (local_90 != local_80) {
    operator_delete(local_90,local_80[0] + 1);
  }
  if (local_b0 != local_a0) {
    operator_delete(local_b0,local_a0[0] + 1);
  }
  *(undefined ***)&this->super_Exception = &PTR__Exception_001b8c10;
  Catch::clara::std::filesystem::__cxx11::path::path((path *)&this->filename_,(path *)filename);
  this->errno_ = error_number;
  return;
}

Assistant:

Exception(const std::string& message, const std::filesystem::path& filename, int error_number)
    : hta::Exception(message + ": " + std::string(filename) + ": " + std::strerror(error_number)),
      filename_(filename), errno_(error_number)
    {
    }